

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_decoder_init__internal
                    (ma_decoder_read_proc onRead,ma_decoder_seek_proc onSeek,void *pUserData,
                    ma_decoder_config *pConfig,ma_decoder *pDecoder)

{
  ma_decoder_config *in_RCX;
  ma_decoder *in_RDX;
  ma_decoder_config *in_RSI;
  ma_decoder *in_R8;
  ma_result result;
  undefined4 in_stack_ffffffffffffffc8;
  ma_result local_4;
  
  local_4 = MA_NO_BACKEND;
  if (in_RCX->encodingFormat != ma_encoding_format_unknown) {
    if (in_RCX->encodingFormat == ma_encoding_format_wav) {
      local_4 = ma_decoder_init_wav__internal
                          ((ma_decoder_config *)in_R8,
                           (ma_decoder *)CONCAT44(0xffffff35,in_stack_ffffffffffffffc8));
    }
    if (in_RCX->encodingFormat == ma_encoding_format_flac) {
      local_4 = ma_decoder_init_flac__internal
                          ((ma_decoder_config *)in_R8,
                           (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
    }
    if (in_RCX->encodingFormat == ma_encoding_format_mp3) {
      local_4 = ma_decoder_init_mp3__internal
                          ((ma_decoder_config *)in_R8,
                           (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
    }
    if (in_RCX->encodingFormat == ma_encoding_format_vorbis) {
      local_4 = ma_decoder_init_vorbis__internal
                          ((ma_decoder_config *)in_R8,
                           (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8));
    }
    if (local_4 != MA_SUCCESS) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
  }
  if (local_4 != MA_SUCCESS) {
    if ((local_4 != MA_SUCCESS) &&
       (local_4 = ma_decoder_init_custom__internal(in_RSI,in_RDX), local_4 != MA_SUCCESS)) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
    if (in_RCX->encodingFormat != ma_encoding_format_unknown) {
      return MA_NO_BACKEND;
    }
    if ((local_4 != MA_SUCCESS) &&
       (local_4 = ma_decoder_init_wav__internal
                            ((ma_decoder_config *)in_R8,
                             (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8)),
       local_4 != MA_SUCCESS)) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
    if ((local_4 != MA_SUCCESS) &&
       (local_4 = ma_decoder_init_flac__internal
                            ((ma_decoder_config *)in_R8,
                             (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8)),
       local_4 != MA_SUCCESS)) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
    if ((local_4 != MA_SUCCESS) &&
       (local_4 = ma_decoder_init_mp3__internal
                            ((ma_decoder_config *)in_R8,
                             (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8)),
       local_4 != MA_SUCCESS)) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
    if ((local_4 != MA_SUCCESS) &&
       (local_4 = ma_decoder_init_vorbis__internal
                            ((ma_decoder_config *)in_R8,
                             (ma_decoder *)CONCAT44(local_4,in_stack_ffffffffffffffc8)),
       local_4 != MA_SUCCESS)) {
      (*(code *)in_RSI)(in_R8,0,0);
    }
  }
  if (local_4 == MA_SUCCESS) {
    local_4 = ma_decoder__postinit(in_RCX,in_R8);
  }
  return local_4;
}

Assistant:

static ma_result ma_decoder_init__internal(ma_decoder_read_proc onRead, ma_decoder_seek_proc onSeek, void* pUserData, const ma_decoder_config* pConfig, ma_decoder* pDecoder)
{
    ma_result result = MA_NO_BACKEND;

    MA_ASSERT(pConfig != NULL);
    MA_ASSERT(pDecoder != NULL);

    /* Silence some warnings in the case that we don't have any decoder backends enabled. */
    (void)onRead;
    (void)onSeek;
    (void)pUserData;


    /* If we've specified a specific encoding type, try that first. */
    if (pConfig->encodingFormat != ma_encoding_format_unknown) {
    #ifdef MA_HAS_WAV
        if (pConfig->encodingFormat == ma_encoding_format_wav) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (pConfig->encodingFormat == ma_encoding_format_flac) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_MP3
        if (pConfig->encodingFormat == ma_encoding_format_mp3) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (pConfig->encodingFormat == ma_encoding_format_vorbis) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
        }
    #endif

        /* If we weren't able to initialize the decoder, seek back to the start to give the next attempts a clean start. */
        if (result != MA_SUCCESS) {
            onSeek(pDecoder, 0, ma_seek_origin_start);
        }
    }

    if (result != MA_SUCCESS) {
        /* Getting here means we couldn't load a specific decoding backend based on the encoding format. */

        /*
        We use trial and error to open a decoder. We prioritize custom decoders so that if they
        implement the same encoding format they take priority over the built-in decoders.
        */
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_custom__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }

        /*
        If we get to this point and we still haven't found a decoder, and the caller has requested a
        specific encoding format, there's no hope for it. Abort.
        */
        if (pConfig->encodingFormat != ma_encoding_format_unknown) {
            return MA_NO_BACKEND;
        }

    #ifdef MA_HAS_WAV
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_wav__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_FLAC
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_flac__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_MP3
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_mp3__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    #ifdef MA_HAS_VORBIS
        if (result != MA_SUCCESS) {
            result = ma_decoder_init_vorbis__internal(pConfig, pDecoder);
            if (result != MA_SUCCESS) {
                onSeek(pDecoder, 0, ma_seek_origin_start);
            }
        }
    #endif
    }

    if (result != MA_SUCCESS) {
        return result;
    }

    return ma_decoder__postinit(pConfig, pDecoder);
}